

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O3

uint32_t __thiscall re2c::Skeleton::rule2key(Skeleton *this,rule_rank_t r)

{
  byte bVar1;
  unsigned_short uVar2;
  uint uVar3;
  rule_rank_t unaff_retaddr;
  
  if (this->sizeof_key == 1) {
    bVar1 = rule2key<unsigned_char>((rule_rank_t)0x0);
    uVar3 = (uint)bVar1;
  }
  else {
    if (this->sizeof_key != 2) {
      uVar3 = rule2key<unsigned_int>(unaff_retaddr);
      return uVar3;
    }
    uVar2 = rule2key<unsigned_short>((rule_rank_t)0x0);
    uVar3 = (uint)uVar2;
  }
  return uVar3;
}

Assistant:

uint32_t Skeleton::rule2key (rule_rank_t r) const
{
	switch (sizeof_key)
	{
		default: // shouldn't happen
		case 4: return rule2key<uint32_t> (r);
		case 2: return rule2key<uint16_t> (r);
		case 1: return rule2key<uint8_t>  (r);
	}
}